

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamfortestoutput.h
# Opt level: O0

ostream * UnitTests::details::streamit<char*,char[6]>
                    (expected_got_outputter_with_coercion<char_*,_char[6]> *s,undefined8 *t)

{
  ostream *poVar1;
  expected_got_outputter<char[6]> local_30;
  expected_got_outputter<char_*> local_28;
  undefined8 *local_20;
  expected_got_outputter_with_coercion<char_*,_char[6]> *t_local;
  ostream *s_local;
  
  local_20 = t;
  t_local = s;
  local_28 = stream<char*>((char **)*t);
  poVar1 = operator<<((ostream *)s,&local_28);
  poVar1 = std::operator<<(poVar1," (uncoerced=");
  local_30 = stream<char[6]>((char (*) [6])local_20[1]);
  poVar1 = operator<<(poVar1,&local_30);
  poVar1 = std::operator<<(poVar1,")");
  return poVar1;
}

Assistant:

std::ostream& streamit(
            std::ostream& s, const expected_got_outputter_with_coercion<T, U>& t, std::false_type /*unused*/)
        {
            return s << stream(t.t) << " (uncoerced=" << stream(t.u) << ")";
        }